

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O0

bool ImGui_ImplOpenGL2_Init(void)

{
  ImGuiIO *pIVar1;
  void *pvVar2;
  ImGui_ImplOpenGL2_Data *bd;
  ImGuiIO *io;
  size_t in_stack_ffffffffffffffc0;
  undefined8 uVar3;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  size_t in_stack_fffffffffffffff0;
  
  pIVar1 = ImGui::GetIO();
  ImGui::DebugCheckVersionAndDataLayout
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,4,in_stack_fffffffffffffff0);
  uVar3 = 4;
  ImGui::MemAlloc(4);
  pvVar2 = operator_new(uVar3);
  ImGui_ImplOpenGL2_Data::ImGui_ImplOpenGL2_Data((ImGui_ImplOpenGL2_Data *)0x2918b3);
  pIVar1->BackendRendererUserData = pvVar2;
  pIVar1->BackendRendererName = "imgui_impl_opengl2";
  return true;
}

Assistant:

bool    ImGui_ImplOpenGL2_Init()
{
    ImGuiIO& io = ImGui::GetIO();
    IMGUI_CHECKVERSION();
    IM_ASSERT(io.BackendRendererUserData == nullptr && "Already initialized a renderer backend!");

    // Setup backend capabilities flags
    ImGui_ImplOpenGL2_Data* bd = IM_NEW(ImGui_ImplOpenGL2_Data)();
    io.BackendRendererUserData = (void*)bd;
    io.BackendRendererName = "imgui_impl_opengl2";

    return true;
}